

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void __thiscall google::protobuf::RepeatedField<long>::Add(RepeatedField<long> *this,long value)

{
  int new_size;
  ulong uVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  bool is_soo;
  bool is_soo_00;
  bool bVar5;
  int local_3c;
  
  uVar1 = (this->soo_rep_).field_0.long_rep.elements_int;
  is_soo_00 = (uVar1 & 4) == 0;
  iVar2 = internal::SooRep::size(&this->soo_rep_,is_soo_00);
  local_3c = 1;
  if ((uVar1 & 4) == 0) {
    pcVar4 = (char *)((long)&(this->soo_rep_).field_0 + 8);
  }
  else {
    local_3c = (this->soo_rep_).field_0.long_rep.capacity;
    pcVar4 = internal::LongSooRep::elements((LongSooRep *)this);
  }
  new_size = iVar2 + 1;
  bVar5 = iVar2 == local_3c;
  if (bVar5) {
    Grow(this,(uVar1 & 4) == 0,iVar2,new_size);
    local_3c = (this->soo_rep_).field_0.long_rep.capacity;
    pcVar4 = internal::LongSooRep::elements((LongSooRep *)this);
  }
  bVar5 = !bVar5;
  is_soo = bVar5 && is_soo_00;
  iVar2 = internal::SooRep::size(&this->soo_rep_,is_soo);
  if ((iVar2 != new_size) &&
     ((undefined1  [16])((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    internal::LongSooRep::elements((LongSooRep *)this);
  }
  set_size(this,is_soo,new_size);
  *(long *)(pcVar4 + (long)iVar2 * 8) = value;
  if (is_soo != ((undefined1  [16])
                 ((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) ==
                (undefined1  [16])0x0)) {
    internal::protobuf_assumption_failed
              ("is_soo == final_is_soo",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
               ,0x366);
  }
  iVar2 = internal::SooRep::size(&this->soo_rep_,is_soo);
  if (new_size != iVar2) {
    internal::protobuf_assumption_failed
              ("new_size == final_size",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
               ,0x368);
  }
  if (bVar5 && is_soo_00) {
    pcVar3 = (char *)((long)&(this->soo_rep_).field_0 + 8);
  }
  else {
    pcVar3 = internal::LongSooRep::elements((LongSooRep *)this);
  }
  if (pcVar4 != pcVar3) {
    internal::protobuf_assumption_failed
              ("elem == final_elements",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
               ,0x36a);
  }
  iVar2 = 1;
  if (!bVar5 || !is_soo_00) {
    iVar2 = (this->soo_rep_).field_0.long_rep.capacity;
  }
  if (local_3c != iVar2) {
    internal::protobuf_assumption_failed
              ("capacity == final_capacity",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
               ,0x36c);
  }
  return;
}

Assistant:

inline void RepeatedField<Element>::Add(Element value) {
  bool is_soo = this->is_soo();
  const int old_size = size(is_soo);
  int capacity = Capacity(is_soo);
  Element* elem = unsafe_elements(is_soo);
  if (ABSL_PREDICT_FALSE(old_size == capacity)) {
    Grow(is_soo, old_size, old_size + 1);
    is_soo = false;
    capacity = Capacity(is_soo);
    elem = unsafe_elements(is_soo);
  }
  int new_size = old_size + 1;
  void* p = elem + ExchangeCurrentSize(is_soo, new_size);
  ::new (p) Element(std::move(value));

  // The below helps the compiler optimize dense loops.
  // Note: we can't call functions in PROTOBUF_ASSUME so use local variables.
  [[maybe_unused]] const bool final_is_soo = this->is_soo();
  PROTOBUF_ASSUME(is_soo == final_is_soo);
  [[maybe_unused]] const int final_size = size(is_soo);
  PROTOBUF_ASSUME(new_size == final_size);
  [[maybe_unused]] Element* const final_elements = unsafe_elements(is_soo);
  PROTOBUF_ASSUME(elem == final_elements);
  [[maybe_unused]] const int final_capacity = Capacity(is_soo);
  PROTOBUF_ASSUME(capacity == final_capacity);
}